

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int mmi_ci_train(model_inventory_t *inv,model_def_t *mdef,lexicon_t *lex,vector_t **f,
                s3lattice_t *lat,float64 a_beam,uint32 mean_reest,uint32 var_reest,feat_t *fcb)

{
  int32 iVar1;
  float64 local_70;
  float64 log_lik;
  state_t *psStack_60;
  uint32 n_state;
  state_t *state_seq;
  vector_t **pppfStack_50;
  uint32 n_word_obs;
  vector_t **arc_f;
  uint local_40;
  uint32 n;
  uint32 k;
  uint32 mean_reest_local;
  float64 a_beam_local;
  s3lattice_t *lat_local;
  vector_t **f_local;
  lexicon_t *lex_local;
  model_def_t *mdef_local;
  model_inventory_t *inv_local;
  
  pppfStack_50 = (vector_t **)0x0;
  log_lik._4_4_ = 0;
  n = mean_reest;
  _k = a_beam;
  a_beam_local = (float64)lat;
  lat_local = (s3lattice_t *)f;
  f_local = (vector_t **)lex;
  lex_local = (lexicon_t *)mdef;
  mdef_local = (model_def_t *)inv;
  printf(" %5u",(ulong)lat->n_arcs);
  for (arc_f._4_4_ = 0; arc_f._4_4_ < *(uint *)a_beam_local; arc_f._4_4_ = arc_f._4_4_ + 1) {
    state_seq._4_4_ =
         (*(int *)(*(long *)((long)a_beam_local + 0x18) + (ulong)arc_f._4_4_ * 0xd8 + 0x84) -
         *(int *)(*(long *)((long)a_beam_local + 0x18) + (ulong)arc_f._4_4_ * 0xd8 + 0x80)) + 1;
    pppfStack_50 = (vector_t **)
                   __ckd_calloc__((ulong)state_seq._4_4_,8,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
                                  ,0x5a3);
    for (local_40 = 0; local_40 < state_seq._4_4_; local_40 = local_40 + 1) {
      pppfStack_50[local_40] =
           *(vector_t **)
            (&lat_local->n_arcs +
            (ulong)((local_40 +
                    *(int *)(*(long *)((long)a_beam_local + 0x18) + (ulong)arc_f._4_4_ * 0xd8 + 0x80
                            )) - 1) * 2);
    }
    psStack_60 = next_utt_states((uint32 *)((long)&log_lik + 4),(lexicon_t *)f_local,
                                 (model_inventory_t *)mdef_local,(model_def_t *)lex_local,
                                 (char *)(*(long *)((long)a_beam_local + 0x18) +
                                         (ulong)arc_f._4_4_ * 0xd8));
    iVar1 = mmi_viterbi_run(&local_70,pppfStack_50,state_seq._4_4_,psStack_60,log_lik._4_4_,
                            (model_inventory_t *)mdef_local,_k);
    if (iVar1 == 0) {
      *(undefined4 *)(*(long *)((long)a_beam_local + 0x18) + (ulong)arc_f._4_4_ * 0xd8 + 0xd0) = 1;
      *(float64 *)(*(long *)((long)a_beam_local + 0x18) + (ulong)arc_f._4_4_ * 0xd8 + 0x98) =
           local_70;
    }
    ckd_free(pppfStack_50);
    if (*(int *)(*(long *)((long)a_beam_local + 0x18) + (ulong)arc_f._4_4_ * 0xd8 + 0xd0) == 0) {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
              ,0x5b7,"arc_%d is ignored (viterbi run failed)\n",(ulong)(arc_f._4_4_ + 1));
    }
  }
  lat_fwd_bwd((s3lattice_t *)a_beam_local);
  for (arc_f._4_4_ = 0; arc_f._4_4_ < *(uint *)a_beam_local; arc_f._4_4_ = arc_f._4_4_ + 1) {
    if (*(int *)(*(long *)((long)a_beam_local + 0x18) + (ulong)arc_f._4_4_ * 0xd8 + 0xd0) == 1) {
      state_seq._4_4_ =
           (*(int *)(*(long *)((long)a_beam_local + 0x18) + (ulong)arc_f._4_4_ * 0xd8 + 0x84) -
           *(int *)(*(long *)((long)a_beam_local + 0x18) + (ulong)arc_f._4_4_ * 0xd8 + 0x80)) + 1;
      pppfStack_50 = (vector_t **)
                     __ckd_calloc__((ulong)state_seq._4_4_,8,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
                                    ,0x5c6);
      for (local_40 = 0; local_40 < state_seq._4_4_; local_40 = local_40 + 1) {
        pppfStack_50[local_40] =
             *(vector_t **)
              (&lat_local->n_arcs +
              (ulong)((local_40 +
                      *(int *)(*(long *)((long)a_beam_local + 0x18) + (ulong)arc_f._4_4_ * 0xd8 +
                              0x80)) - 1) * 2);
      }
      psStack_60 = next_utt_states((uint32 *)((long)&log_lik + 4),(lexicon_t *)f_local,
                                   (model_inventory_t *)mdef_local,(model_def_t *)lex_local,
                                   (char *)(*(long *)((long)a_beam_local + 0x18) +
                                           (ulong)arc_f._4_4_ * 0xd8));
      iVar1 = mmi_viterbi_update(pppfStack_50,state_seq._4_4_,psStack_60,log_lik._4_4_,
                                 (model_inventory_t *)mdef_local,_k,n,var_reest,
                                 *(float64 *)
                                  (*(long *)((long)a_beam_local + 0x18) + (ulong)arc_f._4_4_ * 0xd8
                                  + 0xb0),fcb);
      if (iVar1 != 0) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
                ,0x5d6,"arc_%d is ignored (viterbi update failed)\n",(ulong)(arc_f._4_4_ + 1));
      }
      ckd_free(pppfStack_50);
    }
  }
  return 0;
}

Assistant:

int
mmi_ci_train(model_inventory_t *inv,
	     model_def_t *mdef,
	     lexicon_t *lex,
	     vector_t **f,
	     s3lattice_t *lat,
	     float64 a_beam,
	     uint32 mean_reest,
	     uint32 var_reest,
	     feat_t *fcb)
{
  uint32 k, n;
  vector_t **arc_f = NULL;/* feature vector for a word arc */
  uint32 n_word_obs;/* frames of a word arc */
  state_t *state_seq;/* HMM state sequence for an arc */
  uint32 n_state = 0;/* number of HMM states */
  float64 log_lik;/* log-likelihood of an arc */
  
  /* viterbi run on each arc */
  printf(" %5u", lat->n_arcs);

  for(n=0; n<lat->n_arcs; n++) {
    
    /* total observations of this arc */
    /* this is not very accurate, as it consumes one more frame for each word at the end */
    n_word_obs = lat->arc[n].ef - lat->arc[n].sf + 1;
    
    /* get the feature for this arc */
    arc_f = (vector_t **) ckd_calloc(n_word_obs, sizeof(vector_t *));
    for (k=0; k<n_word_obs; k++)
      arc_f[k] = f[k+lat->arc[n].sf-1];
    
    /* make state list */
    state_seq = next_utt_states(&n_state, lex, inv, mdef, lat->arc[n].word);
    
    /* viterbi compuation to get the acoustic score for a word hypothesis */
    if (mmi_viterbi_run(&log_lik,
			arc_f, n_word_obs,
			state_seq, n_state,
			inv,
			a_beam) == S3_SUCCESS) {
      lat->arc[n].good_arc = 1;
      lat->arc[n].ac_score = log_lik;
    }
    
    ckd_free(arc_f);
    
    if (lat->arc[n].good_arc == 0) {
      E_INFO("arc_%d is ignored (viterbi run failed)\n", n+1);
    }
  }
  
  /* lattice-based forward-backward computation */
  lat_fwd_bwd(lat);
  
  /* update Gaussian parameters */
  for (n=0; n<lat->n_arcs; n++) {
    
    /* only if the arc was successful in viterbi run */
    if (lat->arc[n].good_arc == 1) {
      
      /* total observations of this arc */
      n_word_obs = lat->arc[n].ef - lat->arc[n].sf + 1;
      arc_f = (vector_t **) ckd_calloc(n_word_obs, sizeof(vector_t *));
      for (k=0; k<n_word_obs; k++)
	arc_f[k] = f[k+lat->arc[n].sf-1];
      
      /* make state list */
      state_seq = next_utt_states(&n_state, lex, inv, mdef, lat->arc[n].word);
      
      /* viterbi update model parameters */
      if (mmi_viterbi_update(arc_f, n_word_obs,
			     state_seq, n_state,
			     inv,
			     a_beam,
			     mean_reest,
			     var_reest,
			     lat->arc[n].gamma,
			     fcb) != S3_SUCCESS) {
	E_ERROR("arc_%d is ignored (viterbi update failed)\n", n+1);
      }
      
      ckd_free(arc_f);
    }
  }
  
  return S3_SUCCESS;
}